

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall cfd::TransactionContext::IgnoreVerify(TransactionContext *this,OutPoint *outpoint)

{
  bool bVar1;
  uint32_t uVar2;
  TransactionContext *this_00;
  
  core::OutPoint::GetTxid((Txid *)&stack0xffffffffffffffd0,outpoint);
  uVar2 = core::OutPoint::GetVout(outpoint);
  (*(this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[2])
            (this,&stack0xffffffffffffffd0,(ulong)uVar2);
  this_00 = (TransactionContext *)&stack0xffffffffffffffd0;
  core::Txid::~Txid((Txid *)this_00);
  bVar1 = IsFindOutPoint(this_00,&this->verify_ignore_map_,outpoint);
  if (!bVar1) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>
              ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)
               &this->verify_ignore_map_,outpoint);
  }
  return;
}

Assistant:

void TransactionContext::IgnoreVerify(const OutPoint& outpoint) {
  GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
    verify_ignore_map_.emplace_back(outpoint);
  }
}